

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::
BasicTypeInfo<std::vector<dap::ExceptionPathSegment,_std::allocator<dap::ExceptionPathSegment>_>_>::
~BasicTypeInfo(BasicTypeInfo<std::vector<dap::ExceptionPathSegment,_std::allocator<dap::ExceptionPathSegment>_>_>
               *this)

{
  BasicTypeInfo<std::vector<dap::ExceptionPathSegment,_std::allocator<dap::ExceptionPathSegment>_>_>
  *this_local;
  
  (this->super_TypeInfo)._vptr_TypeInfo = (_func_int **)&PTR__BasicTypeInfo_017f1dd0;
  std::__cxx11::string::~string((string *)&this->name_);
  TypeInfo::~TypeInfo(&this->super_TypeInfo);
  return;
}

Assistant:

constexpr BasicTypeInfo(std::string&& name) : name_(std::move(name)) {}